

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O3

Tile mercatortile::parent(Tile *tile)

{
  Tile TVar1;
  
  TVar1.x = tile->x >> 1;
  TVar1.z = tile->z + -1;
  TVar1.y = tile->y >> 1;
  return TVar1;
}

Assistant:

Tile parent(const Tile &tile)
{
    Tile return_tile;
    if (tile.x % 2 == 0 && tile.y % 2 == 0)
    {
        return_tile = Tile{tile.x / 2, tile.y / 2, tile.z - 1};
    }
    else if (tile.x % 2 == 0)
    {
        return_tile = Tile{tile.x / 2, (tile.y - 1) / 2, tile.z - 1};
    }
    else if (!(tile.x % 2 == 0) && (tile.y % 2 == 0))
    {
        return_tile = Tile{(tile.x - 1) / 2, tile.y / 2, tile.z - 1};
    }
    else
    {
        return_tile = Tile{(tile.x - 1) / 2, (tile.y - 1) / 2, tile.z - 1};
    }

    return return_tile;
}